

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

void __thiscall
DBlockThingsIterator::DBlockThingsIterator
          (DBlockThingsIterator *this,AActor *origin,double checkradius,bool ignorerestricted)

{
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_006f42d8;
  FMultiBlockThingsIterator::FMultiBlockThingsIterator
            (&this->super_FMultiBlockThingsIterator,&this->check,origin,checkradius,false);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_006f42d8;
  (this->check).data.Array = (unsigned_short *)0x0;
  (this->check).data.Most = 0;
  (this->check).data.Count = 0;
  (this->check).method = 1;
  (this->check).varused = '\0';
  (this->check).inited = false;
  (this->cres).thing = (AActor *)0x0;
  (this->cres).Position.X = 0.0;
  (this->cres).Position.Y = 0.0;
  (this->cres).Position.Z = 0.0;
  (this->cres).portalflags = 0;
  return;
}

Assistant:

DBlockThingsIterator(AActor *origin = nullptr, double checkradius = -1, bool ignorerestricted = false)
		: FMultiBlockThingsIterator(check, origin, checkradius, ignorerestricted)
	{
		cres.thing = nullptr;
		cres.Position.Zero();
		cres.portalflags = 0;
	}